

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
resizeLike<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,0>>
          (PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *this,
          EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>_>
          *_other)

{
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>
  *other;
  
  PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)this,4,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }